

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3183:34)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3183:34)>
          *this,string *arg)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ConfigData *pCVar3;
  ReporterSpec *__k;
  int iVar4;
  ReporterSpec *spec;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar5;
  undefined4 extraout_var;
  const_iterator cVar6;
  pointer pRVar7;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  StringRef reporterSpec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  Optional<Catch::ReporterSpec> parsed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  BasicResult<Catch::Clara::ParseResultType> local_e8;
  Optional<Catch::ReporterSpec> local_b8;
  
  this_00 = &bStack_148;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_108);
  local_e8.m_errorMessage._M_dataplus._M_p = (pointer)&local_e8.m_errorMessage.field_2;
  local_e8.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type = Ok;
  local_e8.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_e8.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001a7560;
  local_e8.m_errorMessage._M_string_length = 0;
  local_e8.m_errorMessage.field_2._M_local_buf[0] = '\0';
  if (local_108._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Received empty reporter spec.",(allocator<char> *)&bStack_148);
    BasicResult<Catch::Clara::ParseResultType>::runtimeError
              (__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    goto LAB_0014e2bf;
  }
  reporterSpec.m_size = local_108._M_string_length;
  reporterSpec.m_start = local_108._M_dataplus._M_p;
  parseReporterSpec(&local_b8,reporterSpec);
  __k = local_b8.nullableValue;
  if (local_b8.nullableValue == (ReporterSpec *)0x0) {
    std::operator+(&local_128,"Could not parse reporter spec \'",&local_108);
    std::operator+(&bStack_148,&local_128,"\'");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&bStack_148);
LAB_0014e280:
    std::__cxx11::string::~string((string *)&bStack_148);
    this_00 = &local_128;
LAB_0014e28d:
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    pSVar5 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar4 = (*(pSVar5->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar5);
    lVar1 = *(long *)CONCAT44(extraout_var,iVar4);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                    *)(lVar1 + 0x18),&__k->m_name);
    if (cVar6._M_node == (_Base_ptr)(lVar1 + 0x20)) {
      std::operator+(&local_128,"Unrecognized reporter, \'",&__k->m_name);
      std::operator+(&bStack_148,&local_128,"\'. Check available with --list-reporters");
      BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&bStack_148);
      goto LAB_0014e280;
    }
    pbVar2 = (__k->m_outputFileName).nullableValue;
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>
              (&((this->m_lambda).config)->reporterSpecifications,local_b8.nullableValue);
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pCVar3 = (this->m_lambda).config;
      uVar8 = 0;
      for (pRVar7 = (pCVar3->reporterSpecifications).
                    super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar7 != (pCVar3->reporterSpecifications).
                    super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pRVar7 = pRVar7 + 1) {
        uVar8 = uVar8 + ((pRVar7->m_outputFileName).nullableValue ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      if (uVar8 < 2) goto LAB_0014e299;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_148,"Only one reporter may have unspecified output file.",
                 (allocator<char> *)&local_128);
      BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&bStack_148);
      goto LAB_0014e28d;
    }
LAB_0014e299:
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a7560;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  Optional<Catch::ReporterSpec>::reset(&local_b8);
LAB_0014e2bf:
  BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }